

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.cpp
# Opt level: O2

void __thiscall Vector::Scale(Vector *this,float scale)

{
  float fVar1;
  
  fVar1 = this->m_vec[2];
  *(ulong *)this->m_vec =
       CONCAT44(scale * (float)((ulong)*(undefined8 *)this->m_vec >> 0x20),
                scale * (float)*(undefined8 *)this->m_vec);
  this->m_vec[2] = fVar1 * scale;
  this->m_length = -1.0;
  return;
}

Assistant:

void Vector::Scale(float scale)
{
   float x, y, z;

   x = X() * scale;
   y = Y() * scale;
   z = Z() * scale;

   Set(x, y, z);
}